

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rsgExpression.cpp
# Opt level: O0

float rsg::VariableRead::getWeight(GeneratorState *state,ConstValueRangeAccess valueRange)

{
  IsReadableIntersectingEntry filter;
  ConstValueRangeAccess valueRange_00;
  GeneratorState *state_00;
  bool bVar1;
  int iVar2;
  deUint32 dVar3;
  VariableType *pVVar4;
  ShaderParameters *pSVar5;
  VariableManager *pVVar6;
  IsReadableIntersectingEntry local_40;
  IsReadableEntry local_1c;
  GeneratorState *local_18;
  GeneratorState *state_local;
  
  local_18 = state;
  pVVar4 = ConstValueRangeAccess::getType(&valueRange);
  bVar1 = VariableType::isVoid(pVVar4);
  state_00 = local_18;
  if (bVar1) {
    pVVar6 = GeneratorState::getVariableManager(local_18);
    dVar3 = GeneratorState::getExpressionFlags(local_18);
    rsg::anon_unknown_0::IsReadableEntry::IsReadableEntry(&local_1c,dVar3);
    bVar1 = VariableManager::hasEntry<rsg::(anonymous_namespace)::IsReadableEntry>(pVVar6,local_1c);
    if (!bVar1) {
      pVVar6 = GeneratorState::getVariableManager(local_18);
      iVar2 = VariableManager::getNumAllocatedScalars(pVVar6);
      pSVar5 = GeneratorState::getShaderParameters(local_18);
      if (pSVar5->maxCombinedVariableScalars <= iVar2) {
        return 0.0;
      }
    }
    state_local._4_4_ = 0.05;
  }
  else {
    pVVar4 = ConstValueRangeAccess::getType(&valueRange);
    bVar1 = rsg::anon_unknown_0::canAllocateVariable(state_00,pVVar4);
    if (!bVar1) {
      pVVar6 = GeneratorState::getVariableManager(local_18);
      valueRange_00 = valueRange;
      dVar3 = GeneratorState::getExpressionFlags(local_18);
      rsg::anon_unknown_0::IsReadableIntersectingEntry::IsReadableIntersectingEntry
                (&local_40,valueRange_00,dVar3);
      filter.m_valueRange.m_type = local_40.m_valueRange.m_type;
      filter.super_IsReadableEntry.m_exprFlags = local_40.super_IsReadableEntry.m_exprFlags;
      filter._4_4_ = local_40._4_4_;
      filter.m_valueRange.m_min = local_40.m_valueRange.m_min;
      filter.m_valueRange.m_max = local_40.m_valueRange.m_max;
      bVar1 = VariableManager::hasEntry<rsg::(anonymous_namespace)::IsReadableIntersectingEntry>
                        (pVVar6,filter);
      if (!bVar1) {
        return 0.0;
      }
    }
    state_local._4_4_ = 1.0;
  }
  return state_local._4_4_;
}

Assistant:

float VariableRead::getWeight (const GeneratorState& state, ConstValueRangeAccess valueRange)
{
	if (valueRange.getType().isVoid())
	{
		if (state.getVariableManager().hasEntry(IsReadableEntry(state.getExpressionFlags())) ||
			state.getVariableManager().getNumAllocatedScalars() < state.getShaderParameters().maxCombinedVariableScalars)
			return unusedValueWeight;
		else
			return 0.0f;
	}

	if (!canAllocateVariable(state, valueRange.getType()) &&
		!state.getVariableManager().hasEntry(IsReadableIntersectingEntry(valueRange, state.getExpressionFlags())))
		return 0.0f;
	else
		return 1.0f;
}